

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter_11.cpp
# Opt level: O1

string * capitalize(string *__return_storage_ptr__,string *str)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ostringstream oss;
  char local_1a1;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  if (str->_M_string_length != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    pcVar3 = pcVar2;
    do {
      if (pcVar3 == pcVar2) {
        iVar1 = toupper((int)*pcVar3);
        local_1a1 = (char)iVar1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,&local_1a1,1);
      }
      else {
        iVar1 = tolower((int)*pcVar3);
        local_1a1 = (char)iVar1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,&local_1a1,1);
      }
      pcVar3 = pcVar3 + 1;
      pcVar2 = (str->_M_dataplus)._M_p;
    } while (pcVar3 != pcVar2 + str->_M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string capitalize(const std::string& str)
{
	std::ostringstream oss;
	for (auto it = str.begin(); it != str.end(); ++it)
	{
		if (it == str.begin())
		{
			oss << static_cast<char>(toupper(*it));
		}
		else
		{
			oss << static_cast<char>(tolower(*it));
		}
	}
	return oss.str();
}